

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  wchar_t wVar4;
  archive_string_conv *paVar5;
  undefined4 *puVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  archive_entry *entry_00;
  long lVar10;
  time_t tVar11;
  uint64_t uVar12;
  void *pvVar13;
  size_t sVar14;
  int *piVar15;
  char *pcVar16;
  char in_DL;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  archive_entry *in_RSI;
  archive *in_RDI;
  uint cp;
  uint8_t length;
  char high;
  char extra;
  uint offset;
  uint fn_end;
  uchar flagbyte;
  uchar flagbits;
  uchar highbyte;
  size_t newsize;
  char *newptr;
  size_t distance;
  int ret2;
  int ret;
  unsigned_long crc32_val;
  archive_string_conv *fn_sconv;
  archive_string_conv *sconv;
  int ttime;
  char unp_size [8];
  char packed_size [8];
  char *strp;
  char *filename;
  uint end;
  uint filename_size;
  int64_t header_size;
  rar_file_header file_header;
  rar_header rar_header;
  rar *rar;
  char *endp;
  char *p;
  void *h;
  archive_string_conv *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  wchar_t in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  archive_string_conv *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  char local_df;
  undefined1 local_de;
  char local_dd;
  int in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  byte in_stack_ffffffffffffff2d;
  byte in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  rar *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  int local_b4;
  archive_string_conv *local_a8;
  archive_string_conv *local_a0;
  short *local_80;
  uint local_6c;
  ulong local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_47 [3];
  long lVar21;
  undefined8 *local_38;
  undefined8 *local_30;
  int local_4;
  
  local_b4 = 0;
  lVar21 = *(long *)in_RDI[0x15].archive_format_name;
  local_a0 = *(archive_string_conv **)(lVar21 + 0x4eb0);
  if (local_a0 == (archive_string_conv *)0x0) {
    if (*(int *)(lVar21 + 0x4ea0) == 0) {
      paVar5 = archive_string_default_conversion_for_read(in_RDI);
      *(archive_string_conv **)(lVar21 + 0x4ea8) = paVar5;
      *(undefined4 *)(lVar21 + 0x4ea0) = 1;
    }
    local_a0 = *(archive_string_conv **)(lVar21 + 0x4ea8);
  }
  puVar6 = (undefined4 *)
           __archive_read_ahead
                     ((archive_read *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (size_t)in_stack_fffffffffffffee8,(ssize_t *)0x26b67a);
  if (puVar6 == (undefined4 *)0x0) {
    local_4 = -0x1e;
  }
  else {
    _local_47 = *puVar6;
    uVar1 = archive_le16dec(&stack0xffffffffffffffbc);
    *(uint *)(lVar21 + 0x18) = (uint)uVar1;
    uVar1 = archive_le16dec(&stack0xffffffffffffffbe);
    local_68 = (ulong)uVar1;
    if (local_68 < 0x20) {
      archive_set_error(in_RDI,0x54,"Invalid header size");
      local_4 = -0x1e;
    }
    else {
      uVar7 = crc32(0,(long)puVar6 + 2,5);
      __archive_read_consume
                ((archive_read *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (int64_t)in_stack_fffffffffffffee8);
      if ((*(uint *)(lVar21 + 0x18) & 0x10) == 0) {
        *(undefined1 *)(lVar21 + 0x17) = 0;
        *(undefined8 *)(lVar21 + 0x20) = 0;
        *(undefined8 *)(lVar21 + 0x28) = 0;
        *(undefined8 *)(lVar21 + 0x30) = 0;
        *(undefined8 *)(lVar21 + 0x78) = 0;
        *(undefined8 *)(lVar21 + 0x68) = 0;
        *(undefined8 *)(lVar21 + 0x88) = 0;
        *(undefined4 *)(lVar21 + 0x40) = 0;
        memset((void *)(lVar21 + 0x60),0,8);
        *(undefined8 *)(lVar21 + 0x68) = 0;
        *(undefined8 *)(lVar21 + 0x70) = 0;
        *(undefined8 *)(lVar21 + 0x78) = 0;
        *(undefined8 *)(lVar21 + 0x80) = 0;
        *(undefined8 *)(lVar21 + 0x30) = 0;
        *(undefined8 *)(lVar21 + 0x38) = 0;
        *(undefined8 *)(lVar21 + 0x88) = 0;
        *(undefined8 *)(lVar21 + 0x90) = 0;
        puVar8 = (undefined8 *)
                 __archive_read_ahead
                           ((archive_read *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (size_t)in_stack_fffffffffffffee8,(ssize_t *)0x26b8f1);
        if (puVar8 == (undefined8 *)0x0) {
          local_4 = -0x1e;
        }
        else {
          uVar9 = crc32(uVar7,puVar8,uVar1 - 7);
          entry_00 = (archive_entry *)(uVar9 & 0xffff);
          uVar1 = archive_le16dec(local_47);
          if (entry_00 == (archive_entry *)(ulong)uVar1) {
            lVar10 = (long)puVar8 + local_68;
            local_60 = *puVar8;
            local_58 = puVar8[1];
            local_30 = (undefined8 *)((long)puVar8 + 0x19);
            *(char *)(lVar21 + 0x17) = (char)((ulong)puVar8[2] >> 0x10);
            archive_le32dec((void *)((long)&local_58 + 5));
            tVar11 = get_time(in_stack_ffffffffffffff24);
            *(time_t *)(lVar21 + 0x30) = tVar11;
            uVar2 = archive_le32dec((void *)((long)&local_58 + 1));
            *(ulong *)(lVar21 + 8) = (ulong)uVar2;
            if ((*(uint *)(lVar21 + 0x18) & 4) != 0) {
              archive_entry_set_is_data_encrypted(in_RSI,'\x01');
              *(undefined4 *)(lVar21 + 0x4ee8) = 1;
              archive_set_error(in_RDI,0x54,"RAR encryption support unavailable.");
            }
            if ((*(uint *)(lVar21 + 0x18) & 0x100) == 0) {
              uVar2 = archive_le32dec(&local_60);
              *(ulong *)(lVar21 + 0x20) = (ulong)uVar2;
              uVar2 = archive_le32dec((void *)((long)&local_60 + 4));
              *(ulong *)(lVar21 + 0x28) = (ulong)uVar2;
            }
            else {
              local_30 = (undefined8 *)((long)puVar8 + 0x21);
              uVar12 = archive_le64dec((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                        in_stack_fffffffffffffef0));
              *(uint64_t *)(lVar21 + 0x20) = uVar12;
              uVar12 = archive_le64dec((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                        in_stack_fffffffffffffef0));
              *(uint64_t *)(lVar21 + 0x28) = uVar12;
            }
            if ((*(long *)(lVar21 + 0x20) < 0) || (*(long *)(lVar21 + 0x28) < 0)) {
              archive_set_error(in_RDI,0x54,"Invalid sizes specified.");
              local_4 = -0x1e;
            }
            else {
              *(undefined8 *)(lVar21 + 0xa0) = *(undefined8 *)(lVar21 + 0x20);
              if (in_DL == 'z') {
                local_68 = *(long *)(lVar21 + 0x20) + local_68;
                pvVar13 = __archive_read_ahead
                                    ((archive_read *)
                                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                     (size_t)in_stack_fffffffffffffee8,(ssize_t *)0x26bc76);
                if (pvVar13 == (void *)0x0) {
                  return -0x1e;
                }
                lVar10 = (long)pvVar13 + local_68;
                local_30 = (undefined8 *)(((long)local_30 - (long)puVar8) + (long)pvVar13);
              }
              local_38 = (undefined8 *)(lVar10 + -7);
              uVar1 = archive_le16dec(&stack0xffffffffffffffb3);
              uVar19 = (uint)uVar1;
              if (local_38 < (undefined8 *)((long)local_30 + (ulong)uVar19)) {
                archive_set_error(in_RDI,0x54,"Invalid filename size");
                local_4 = -0x1e;
              }
              else {
                if (*(ulong *)(lVar21 + 0x58) < (ulong)(uVar19 * 2 + 2)) {
                  in_stack_ffffffffffffff30 = (rar *)(ulong)(uVar19 * 2 + 2);
                  in_stack_ffffffffffffff38 =
                       (char *)realloc(*(void **)(lVar21 + 0x48),(size_t)in_stack_ffffffffffffff30);
                  if (in_stack_ffffffffffffff38 == (char *)0x0) {
                    archive_set_error(in_RDI,0xc,"Couldn\'t allocate memory.");
                    return -0x1e;
                  }
                  *(char **)(lVar21 + 0x48) = in_stack_ffffffffffffff38;
                  *(rar **)(lVar21 + 0x58) = in_stack_ffffffffffffff30;
                }
                local_80 = *(short **)(lVar21 + 0x48);
                memcpy(local_80,local_30,(ulong)uVar19);
                *(undefined1 *)((long)local_80 + (ulong)uVar19) = 0;
                uVar18 = uVar19;
                local_6c = uVar19;
                if ((*(uint *)(lVar21 + 0x18) & 0x200) == 0) {
                  local_a8 = local_a0;
                  while (pcVar16 = strchr((char *)local_80,0x5c), pcVar16 != (char *)0x0) {
                    *pcVar16 = '/';
                  }
                }
                else {
                  in_stack_ffffffffffffff08 = (archive_string_conv *)(ulong)uVar19;
                  paVar5 = (archive_string_conv *)strlen((char *)local_80);
                  if (in_stack_ffffffffffffff08 == paVar5) {
                    if (*(long *)(lVar21 + 0x4eb8) == 0) {
                      paVar5 = archive_string_conversion_from_charset
                                         ((archive *)
                                          CONCAT17(in_stack_ffffffffffffff07,
                                                   in_stack_ffffffffffffff00),
                                          in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
                      *(archive_string_conv **)(lVar21 + 0x4eb8) = paVar5;
                      if (*(long *)(lVar21 + 0x4eb8) == 0) {
                        return -0x1e;
                      }
                    }
                    local_a8 = *(archive_string_conv **)(lVar21 + 0x4eb8);
                    while (pcVar16 = strchr((char *)local_80,0x5c), pcVar16 != (char *)0x0) {
                      *pcVar16 = '/';
                    }
                  }
                  else {
                    in_stack_ffffffffffffff28 = uVar19 << 1;
                    local_6c = 0;
                    sVar14 = strlen((char *)local_80);
                    in_stack_ffffffffffffff2f =
                         *(undefined1 *)((long)local_30 + (ulong)((int)sVar14 + 1));
                    in_stack_ffffffffffffff2e = 0;
                    in_stack_ffffffffffffff2d = 0;
                    uVar18 = (int)sVar14 + 2;
                    while (in_stack_ffffffffffffff07 =
                                uVar18 < uVar19 && local_6c < in_stack_ffffffffffffff28,
                          uVar18 < uVar19 && local_6c < in_stack_ffffffffffffff28) {
                      uVar17 = uVar18;
                      if (in_stack_ffffffffffffff2e == 0) {
                        uVar17 = uVar18 + 1;
                        in_stack_ffffffffffffff2d = *(byte *)((long)local_30 + (ulong)uVar18);
                        in_stack_ffffffffffffff2e = 8;
                      }
                      in_stack_ffffffffffffff2e = in_stack_ffffffffffffff2e - 2;
                      in_stack_fffffffffffffef8 =
                           (char *)(ulong)(in_stack_ffffffffffffff2d >>
                                           (in_stack_ffffffffffffff2e & 0x1f) & 3);
                      uVar18 = uVar17;
                      switch(in_stack_fffffffffffffef8) {
                      case (char *)0x0:
                        uVar20 = local_6c + 1;
                        *(undefined1 *)((long)local_80 + (ulong)local_6c) = 0;
                        uVar18 = uVar17 + 1;
                        local_6c = local_6c + 2;
                        *(undefined1 *)((long)local_80 + (ulong)uVar20) =
                             *(undefined1 *)((long)local_30 + (ulong)uVar17);
                        break;
                      case (char *)0x1:
                        uVar20 = local_6c + 1;
                        *(undefined1 *)((long)local_80 + (ulong)local_6c) =
                             in_stack_ffffffffffffff2f;
                        uVar18 = uVar17 + 1;
                        local_6c = local_6c + 2;
                        *(undefined1 *)((long)local_80 + (ulong)uVar20) =
                             *(undefined1 *)((long)local_30 + (ulong)uVar17);
                        break;
                      case (char *)0x2:
                        uVar18 = local_6c + 1;
                        *(undefined1 *)((long)local_80 + (ulong)local_6c) =
                             *(undefined1 *)((long)local_30 + (ulong)uVar17 + 1);
                        local_6c = local_6c + 2;
                        *(undefined1 *)((long)local_80 + (ulong)uVar18) =
                             *(undefined1 *)((long)local_30 + (ulong)uVar17);
                        uVar18 = uVar17 + 2;
                        break;
                      case (char *)0x3:
                        uVar18 = uVar17 + 1;
                        if ((*(byte *)((long)local_30 + (ulong)uVar17) & 0x80) == 0) {
                          local_de = 0;
                          local_dd = '\0';
                        }
                        else {
                          local_dd = *(char *)((long)local_30 + (ulong)uVar18);
                          local_de = in_stack_ffffffffffffff2f;
                          uVar18 = uVar17 + 2;
                        }
                        local_df = (*(byte *)((long)local_30 + (ulong)uVar17) & 0x7f) + 2;
                        wVar4 = in_stack_fffffffffffffef4;
                        while( true ) {
                          in_stack_fffffffffffffef4 = wVar4 & 0xffffff;
                          if (local_df != '\0') {
                            in_stack_fffffffffffffef4 =
                                 CONCAT13(local_6c < in_stack_ffffffffffffff28,(int3)wVar4);
                          }
                          if ((char)((uint)in_stack_fffffffffffffef4 >> 0x18) == '\0') break;
                          in_stack_ffffffffffffff1c = local_6c >> 1;
                          uVar17 = local_6c + 1;
                          *(undefined1 *)((long)local_80 + (ulong)local_6c) = local_de;
                          local_6c = local_6c + 2;
                          *(char *)((long)local_80 + (ulong)uVar17) =
                               *(char *)((long)local_30 + (ulong)in_stack_ffffffffffffff1c) +
                               local_dd;
                          local_df = local_df + -1;
                          wVar4 = in_stack_fffffffffffffef4;
                        }
                      }
                    }
                    if (in_stack_ffffffffffffff28 < local_6c) {
                      archive_set_error(in_RDI,0x54,"Invalid filename");
                      return -0x1e;
                    }
                    uVar19 = local_6c + 1;
                    *(undefined1 *)((long)local_80 + (ulong)local_6c) = 0;
                    local_6c = local_6c + 2;
                    *(undefined1 *)((long)local_80 + (ulong)uVar19) = 0;
                    if (*(long *)(lVar21 + 0x4ec0) == 0) {
                      paVar5 = archive_string_conversion_from_charset
                                         ((archive *)
                                          CONCAT17(in_stack_ffffffffffffff07,
                                                   in_stack_ffffffffffffff00),
                                          in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
                      *(archive_string_conv **)(lVar21 + 0x4ec0) = paVar5;
                      if (*(long *)(lVar21 + 0x4ec0) == 0) {
                        return -0x1e;
                      }
                    }
                    local_a8 = *(archive_string_conv **)(lVar21 + 0x4ec0);
                    for (; *local_80 != 0; local_80 = local_80 + 1) {
                      if (*local_80 == 0x5c00) {
                        *(undefined1 *)((long)local_80 + 1) = 0x2f;
                      }
                    }
                  }
                }
                local_30 = (undefined8 *)((long)local_30 + (ulong)uVar18);
                if ((*(long *)(lVar21 + 0x50) == 0) ||
                   (iVar3 = memcmp(*(void **)(lVar21 + 0x48),*(void **)(lVar21 + 0x50),
                                   (ulong)(local_6c + 1)), iVar3 != 0)) {
                  pvVar13 = realloc(*(void **)(lVar21 + 0x50),(ulong)(local_6c + 1));
                  *(void **)(lVar21 + 0x50) = pvVar13;
                  memcpy(*(void **)(lVar21 + 0x50),*(void **)(lVar21 + 0x48),(ulong)(local_6c + 1));
                  free(*(void **)(lVar21 + 0xf8));
                  pvVar13 = calloc(1,0x18);
                  *(void **)(lVar21 + 0xf8) = pvVar13;
                  if (pvVar13 == (void *)0x0) {
                    archive_set_error(in_RDI,0xc,"Couldn\'t allocate memory.");
                    local_4 = -0x1e;
                  }
                  else {
                    **(ulong **)(lVar21 + 0xf8) = local_68;
                    *(undefined8 *)(*(long *)(lVar21 + 0xf8) + 8) = 0xffffffffffffffff;
                    *(undefined8 *)(*(long *)(lVar21 + 0xf8) + 0x10) = 0xffffffffffffffff;
                    *(undefined4 *)(lVar21 + 0x100) = 0;
                    *(undefined4 *)(lVar21 + 0x104) = 1;
                    if ((*(uint *)(lVar21 + 0x18) & 0x400) != 0) {
                      if (local_38 < local_30 + 1) {
                        archive_set_error(in_RDI,0x54,"Invalid header size");
                        return -0x1e;
                      }
                      *(undefined8 *)(lVar21 + 0x60) = *local_30;
                    }
                    if (((*(uint *)(lVar21 + 0x18) & 0x1000) == 0) ||
                       (iVar3 = read_exttime(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                             (char *)CONCAT17(in_stack_ffffffffffffff2f,
                                                              CONCAT16(in_stack_ffffffffffffff2e,
                                                                       CONCAT15(
                                                  in_stack_ffffffffffffff2d,
                                                  CONCAT14(in_stack_ffffffffffffff2c,
                                                           in_stack_ffffffffffffff28))))),
                       -1 < iVar3)) {
                      __archive_read_consume
                                ((archive_read *)
                                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                 (int64_t)in_stack_fffffffffffffee8);
                      *(undefined8 *)(*(long *)(lVar21 + 0xf8) + 8) =
                           *(undefined8 *)in_RDI[8].compression_name;
                      *(long *)(*(long *)(lVar21 + 0xf8) + 0x10) =
                           *(long *)(*(long *)(lVar21 + 0xf8) + 8) + *(long *)(lVar21 + 0x20);
                      uVar19 = (uint)(char)local_58;
                      if (uVar19 < 3) {
                        uVar2 = archive_le32dec(&stack0xffffffffffffffb5);
                        *(uint32_t *)(lVar21 + 0x40) = uVar2;
                        if ((*(uint *)(lVar21 + 0x40) & 0x10) == 0) {
                          *(undefined4 *)(lVar21 + 0x40) = 0x8000;
                        }
                        else {
                          *(undefined4 *)(lVar21 + 0x40) = 0x4049;
                        }
                        *(uint *)(lVar21 + 0x40) = *(uint *)(lVar21 + 0x40) | 0x1a4;
                      }
                      else {
                        if (2 < uVar19 - 3) {
                          archive_set_error(in_RDI,0x54,
                                            "Unknown file attributes from RAR file\'s host OS");
                          return -0x1e;
                        }
                        uVar2 = archive_le32dec(&stack0xffffffffffffffb5);
                        *(uint32_t *)(lVar21 + 0x40) = uVar2;
                      }
                      *(undefined8 *)(lVar21 + 0x98) = 0;
                      *(undefined8 *)(lVar21 + 0xa8) = 0;
                      *(undefined8 *)(lVar21 + 0xb0) = 0;
                      *(undefined8 *)(lVar21 + 0x330) = 0;
                      *(undefined8 *)(lVar21 + 0xc0) = 0;
                      *(undefined4 *)(lVar21 + 0xe0) = 0;
                      *(undefined8 *)(lVar21 + 0xb8) = 0;
                      *(undefined4 *)(lVar21 + 0x4ed0) = 0;
                      *(undefined8 *)(lVar21 + 0x4ed8) = 0;
                      *(undefined8 *)(lVar21 + 0xe8) = 0;
                      *(undefined1 *)(lVar21 + 0xe5) = 0;
                      *(undefined1 *)(lVar21 + 200) = 1;
                      *(undefined1 *)(lVar21 + 0x36b) = 0;
                      *(undefined1 *)(lVar21 + 0x368) = 1;
                      free(*(void **)(lVar21 + 0xd8));
                      *(undefined8 *)(lVar21 + 0xd8) = 0;
                      *(undefined4 *)(lVar21 + 0xcc) = 0;
                      *(undefined4 *)(lVar21 + 0xd0) = 0x20000;
                      memset((void *)(lVar21 + 0x188),0,0x194);
                      Ppmd7_Free((CPpmd7 *)CONCAT44(in_stack_fffffffffffffef4,uVar19),
                                 (ISzAlloc *)in_stack_fffffffffffffee8);
                      *(undefined1 *)(lVar21 + 0x36a) = 0;
                      *(undefined1 *)(lVar21 + 0x369) = 0;
                      if (in_DL == 'z') {
                        local_4 = 0;
                      }
                      else {
                        archive_entry_set_mtime
                                  (in_RSI,*(time_t *)(lVar21 + 0x30),*(long *)(lVar21 + 0x38));
                        archive_entry_set_ctime
                                  (in_RSI,*(time_t *)(lVar21 + 0x78),*(long *)(lVar21 + 0x80));
                        archive_entry_set_atime
                                  (in_RSI,*(time_t *)(lVar21 + 0x68),*(long *)(lVar21 + 0x70));
                        archive_entry_set_size(in_RSI,*(int64_t *)(lVar21 + 0x28));
                        archive_entry_set_mode(in_RSI,*(mode_t *)(lVar21 + 0x40));
                        wVar4 = _archive_entry_copy_pathname_l
                                          ((archive_entry *)
                                           CONCAT17(in_stack_ffffffffffffff07,
                                                    in_stack_ffffffffffffff00),
                                           in_stack_fffffffffffffef8,
                                           CONCAT44(in_stack_fffffffffffffef4,uVar19),
                                           in_stack_fffffffffffffee8);
                        if (wVar4 != L'\0') {
                          piVar15 = __errno_location();
                          if (*piVar15 == 0xc) {
                            archive_set_error(in_RDI,0xc,"Can\'t allocate memory for Pathname");
                            return -0x1e;
                          }
                          pcVar16 = archive_string_conversion_charset_name(local_a8);
                          archive_set_error(in_RDI,0x54,
                                            "Pathname cannot be converted from %s to current locale."
                                            ,pcVar16);
                          local_b4 = -0x14;
                        }
                        if ((*(uint *)(lVar21 + 0x40) & 0xf000) == 0xa000) {
                          *(undefined8 *)(lVar21 + 0xa0) = 0;
                          archive_entry_set_size(in_RSI,0);
                          iVar3 = read_symlink_stored((archive_read *)
                                                      CONCAT44(in_stack_ffffffffffffff1c,
                                                               in_stack_ffffffffffffff18),entry_00,
                                                      in_stack_ffffffffffffff08);
                          if (iVar3 < -0x14) {
                            return iVar3;
                          }
                          if (iVar3 < local_b4) {
                            local_b4 = iVar3;
                          }
                        }
                        if (*(long *)(lVar21 + 0xa0) == 0) {
                          *(undefined1 *)(lVar21 + 0xe5) = 1;
                        }
                        local_4 = local_b4;
                      }
                    }
                    else {
                      archive_set_error(in_RDI,0x54,"Invalid header size");
                      local_4 = -0x1e;
                    }
                  }
                }
                else {
                  __archive_read_consume
                            ((archive_read *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (int64_t)in_stack_fffffffffffffee8);
                  *(int *)(lVar21 + 0x100) = *(int *)(lVar21 + 0x100) + 1;
                  if (*(uint *)(lVar21 + 0x104) <= *(uint *)(lVar21 + 0x100)) {
                    *(int *)(lVar21 + 0x104) = *(int *)(lVar21 + 0x104) + 1;
                    pvVar13 = realloc(*(void **)(lVar21 + 0xf8),
                                      (ulong)*(uint *)(lVar21 + 0x104) * 0x18);
                    *(void **)(lVar21 + 0xf8) = pvVar13;
                    if (pvVar13 == (void *)0x0) {
                      archive_set_error(in_RDI,0xc,"Couldn\'t allocate memory.");
                      return -0x1e;
                    }
                    *(ulong *)(*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18) =
                         local_68;
                    *(undefined8 *)
                     (*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 + 8) =
                         0xffffffffffffffff;
                    *(undefined8 *)
                     (*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 + 0x10) =
                         0xffffffffffffffff;
                  }
                  if (*(long *)(*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 +
                               8) < 0) {
                    *(undefined8 *)
                     (*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 + 8) =
                         *(undefined8 *)in_RDI[8].compression_name;
                    *(long *)(*(long *)(lVar21 + 0xf8) + (ulong)*(uint *)(lVar21 + 0x100) * 0x18 +
                             0x10) =
                         *(long *)(*(long *)(lVar21 + 0xf8) +
                                   (ulong)*(uint *)(lVar21 + 0x100) * 0x18 + 8) +
                         *(long *)(lVar21 + 0x20);
                  }
                  local_4 = 0;
                }
              }
            }
          }
          else {
            archive_set_error(in_RDI,0x54,"Header CRC error");
            local_4 = -0x1e;
          }
        }
      }
      else {
        archive_set_error(in_RDI,0x54,"RAR solid archive support unavailable.");
        local_4 = -0x1e;
      }
    }
  }
  return local_4;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry, &use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}